

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall chaiscript::detail::Dispatch_Function::~Dispatch_Function(Dispatch_Function *this)

{
  Dispatch_Function *in_RDI;
  
  ~Dispatch_Function(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

virtual ~Dispatch_Function() {}